

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O0

bool dxil_spv::emit_create_handle_for_lib_instruction(Impl *impl,CallInst *instruction)

{
  ResourceType resource_type;
  uint resource_range;
  Value *instruction_offset;
  CallInst *pCVar1;
  CallInst *impl_00;
  bool bVar2;
  size_type sVar3;
  iterator __position;
  pointer ppVar4;
  _Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
  local_50;
  Value *local_48;
  _Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
  local_40;
  iterator itr;
  CallInst *local_28;
  CallInst *local_20;
  CallInst *instruction_local;
  Impl *impl_local;
  
  local_28 = instruction;
  local_20 = instruction;
  instruction_local = (CallInst *)impl;
  sVar3 = std::
          unordered_set<const_LLVMBC::Value_*,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Value_*>_>
          ::count(&impl->llvm_annotate_handle_lib_uses,(key_type *)&local_28);
  if (sVar3 == 0) {
    bVar2 = resource_handle_needs_sink((Impl *)instruction_local,local_20);
    if (bVar2) {
      pCVar1 = instruction_local + 0x1b;
      __position = std::
                   unordered_set<const_LLVMBC::CallInst_*,_std::hash<const_LLVMBC::CallInst_*>,_std::equal_to<const_LLVMBC::CallInst_*>,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::CallInst_*>_>
                   ::find((unordered_set<const_LLVMBC::CallInst_*,_std::hash<const_LLVMBC::CallInst_*>,_std::equal_to<const_LLVMBC::CallInst_*>,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::CallInst_*>_>
                           *)&instruction_local[0x1b].super_Instruction.operands,&local_20);
      std::
      unordered_set<const_LLVMBC::CallInst_*,_std::hash<const_LLVMBC::CallInst_*>,_std::equal_to<const_LLVMBC::CallInst_*>,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::CallInst_*>_>
      ::erase((unordered_set<const_LLVMBC::CallInst_*,_std::hash<const_LLVMBC::CallInst_*>,_std::equal_to<const_LLVMBC::CallInst_*>,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::CallInst_*>_>
               *)&(pCVar1->super_Instruction).operands,__position);
      impl_local._7_1_ = true;
    }
    else {
      pCVar1 = instruction_local + 0xb;
      local_48 = LLVMBC::Instruction::getOperand(&local_20->super_Instruction,1);
      local_40._M_cur =
           (__node_type *)
           std::
           unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::ResourceMetaReference,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>_>
           ::find((unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::ResourceMetaReference,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>_>
                   *)&(pCVar1->super_Instruction).super_Value.kind,&local_48);
      local_50._M_cur =
           (__node_type *)
           std::
           unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::ResourceMetaReference,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>_>
           ::end((unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::ResourceMetaReference,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>_>
                  *)&instruction_local[0xb].super_Instruction.super_Value.kind);
      bVar2 = std::__detail::operator==(&local_40,&local_50);
      impl_00 = instruction_local;
      pCVar1 = local_20;
      if (bVar2) {
        impl_local._7_1_ = false;
      }
      else {
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false,_false>
                               *)&local_40);
        resource_type = (ppVar4->second).type;
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false,_false>
                               *)&local_40);
        resource_range = (ppVar4->second).meta_index;
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false,_false>
                               *)&local_40);
        instruction_offset = (ppVar4->second).offset;
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false,_false>
                               *)&local_40);
        impl_local._7_1_ =
             emit_create_handle((Impl *)impl_00,pCVar1,resource_type,resource_range,
                                instruction_offset,(bool)((ppVar4->second).non_uniform & 1));
      }
    }
  }
  else {
    impl_local._7_1_ = true;
  }
  return impl_local._7_1_;
}

Assistant:

bool emit_create_handle_for_lib_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	// Defer creating any handles since annotateHandle is actually going to do it.
	if (impl.llvm_annotate_handle_lib_uses.count(instruction))
		return true;

	if (resource_handle_needs_sink(impl, instruction))
	{
		impl.resource_handles_needing_sink.erase(impl.resource_handles_needing_sink.find(instruction));
		return true;
	}

	auto itr = impl.llvm_global_variable_to_resource_mapping.find(instruction->getOperand(1));
	if (itr == impl.llvm_global_variable_to_resource_mapping.end())
		return false;

	return emit_create_handle(impl, instruction, itr->second.type,
	                          itr->second.meta_index, itr->second.offset, itr->second.non_uniform);
}